

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O2

void __thiscall OpenMD::NgammaT::evolveEtaB(NgammaT *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Mat3x3d hmat;
  Mat3x3d local_50;
  
  Snapshot::getHmat(&local_50,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap
                   );
  dVar4 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis1_ * 0x20);
  dVar7 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis2_ * 0x20);
  dVar6 = *(double *)
           ((long)local_50.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)this->axis_ * 0x20);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->prevEta_,(RectMatrix<double,_3U,_3U> *)&this->eta)
  ;
  dVar6 = -dVar6;
  dVar5 = (this->super_NPT).targetPressure / 163882576.0;
  uVar2 = (ulong)this->axis2_;
  dVar1 = *(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + uVar2 * 0x20);
  uVar3 = (ulong)this->axis_;
  dVar7 = dVar4 * dVar7 * (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar4 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar3 * 0x20) -
       (((*(double *)
           ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                  super_RectMatrix<double,_3U,_3U>.data_ + (ulong)this->axis1_ * 0x20) - dVar5) *
         dVar6 - this->surfaceTension_) * dVar7) / dVar4;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar2 * 0x20) =
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar2 * 0x20) - (((dVar1 - dVar5) * dVar6 - this->surfaceTension_) * dVar7) / dVar4;
  *(undefined8 *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar3 * 0x20) = 0;
  return;
}

Assistant:

void NgammaT::evolveEtaB() {
    Mat3x3d hmat      = snap->getHmat();
    RealType hz       = hmat(axis_, axis_);
    RealType Axy      = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);
    prevEta_          = eta;
    RealType sx       = -hz * (press(axis1_, axis1_) -
                         targetPressure / Constants::pressureConvert);
    RealType sy       = -hz * (press(axis2_, axis2_) -
                         targetPressure / Constants::pressureConvert);
    eta(axis_, axis_) = oldEta_(axis_, axis_) -
                        dt2 * Axy * (sx - surfaceTension_) / (NkBT * tb2);
    eta(axis2_, axis2_) = oldEta_(axis2_, axis2_) -
                          dt2 * Axy * (sy - surfaceTension_) / (NkBT * tb2);
    eta(axis_, axis_) = 0.0;
  }